

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_sync.cpp
# Opt level: O2

void __thiscall
DSDcc::DSDSync::matchSome
          (DSDSync *this,uchar *start,int maxHistory,SyncPattern *patterns,int nbPatterns)

{
  uchar uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int ip;
  ulong uVar6;
  
  for (lVar2 = 0; lVar2 != 0x6c; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)this->m_syncErrors + lVar2) = 0;
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)nbPatterns;
  if (nbPatterns < 1) {
    uVar4 = uVar3;
  }
  uVar5 = 0;
  if (0 < maxHistory) {
    uVar5 = (ulong)(uint)maxHistory;
  }
  for (; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    uVar1 = start[uVar3];
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      lVar2 = (long)(int)patterns[uVar6];
      if (((this->m_syncErrors[lVar2] <= *(uint *)(m_syncLenTol + lVar2 * 8 + 4)) &&
          ((&m_syncPatterns)[(long)(((int)uVar3 - maxHistory) + 0x20) + lVar2 * 0x20] != '\0')) &&
         (uVar1 != (&m_syncPatterns)[(long)(((int)uVar3 - maxHistory) + 0x20) + lVar2 * 0x20])) {
        this->m_syncErrors[lVar2] = this->m_syncErrors[lVar2] + 1;
      }
    }
  }
  return;
}

Assistant:

void DSDSync::matchSome(const unsigned char *start, int maxHistory, const SyncPattern *patterns, int nbPatterns)
{
    std::fill(m_syncErrors, m_syncErrors + m_patterns, 0);
    int pshift = m_history - maxHistory;

    for (int i = 0; i < maxHistory; i++)
    {
        unsigned char c = start[i];

        for (int ip = 0; ip < nbPatterns; ip++)
        {
            int p = (int) patterns[ip];

            if (m_syncErrors[p] > m_syncLenTol[p][1]) {
                continue;
            }
            if ((m_syncPatterns[p][i+pshift] != 0) && (c != m_syncPatterns[p][i+pshift])) {
                m_syncErrors[p]++;
            }
        }
    }
}